

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

int Abc_NodeMffcInside(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vInside)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int i;
  
  for (iVar3 = 0; iVar3 < vLeaves->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(vLeaves,iVar3);
    *(int *)((long)pvVar2 + 0x2c) = *(int *)((long)pvVar2 + 0x2c) + 1;
  }
  iVar3 = Abc_NodeDeref_rec(pNode);
  i = 0;
  Abc_NodeMffcConeSupp(pNode,vInside,(Vec_Ptr_t *)0x0);
  iVar1 = Abc_NodeRef_rec(pNode);
  if (iVar3 == iVar1) {
    for (; i < vLeaves->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(vLeaves,i);
      *(int *)((long)pvVar2 + 0x2c) = *(int *)((long)pvVar2 + 0x2c) + -1;
    }
    return iVar3;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                ,0x16c,"int Abc_NodeMffcInside(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

int Abc_NodeMffcInside( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vInside )
{
    Abc_Obj_t * pObj;
    int i, Count1, Count2;
    // increment the fanout counters for the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->vFanouts.nSize++;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Abc_NodeMffcConeSupp( pNode, vInside, NULL );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    // remove the extra counters
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->vFanouts.nSize--;
    return Count1;
}